

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascr.c
# Opt level: O2

void ascr_shift_one_cache_frame(ascr_t *a,int32 win_efv)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  iVar2 = 1;
  if (1 < win_efv) {
    iVar2 = win_efv;
  }
  uVar1 = 0;
  while (uVar3 = uVar1, uVar3 != iVar2 - 1) {
    a->cache_best_list[uVar3] = a->cache_best_list[uVar3 + 1];
    for (lVar4 = 0; uVar1 = uVar3 + 1, lVar4 < a->n_cisen; lVar4 = lVar4 + 1) {
      a->cache_ci_senscr[uVar3][lVar4] = a->cache_ci_senscr[uVar3 + 1][lVar4];
    }
  }
  return;
}

Assistant:

void
ascr_shift_one_cache_frame(ascr_t * a, int32 win_efv)
{
    int32 i, j;
    for (i = 0; i < win_efv - 1; i++) {
        a->cache_best_list[i] = a->cache_best_list[i + 1];
        for (j = 0; j < a->n_cisen; j++) {
            a->cache_ci_senscr[i][j] = a->cache_ci_senscr[i + 1][j];
        }
    }
}